

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_opl3.cpp
# Opt level: O0

double s_dmxFreq(double tone)

{
  long local_40;
  int_fast32_t freqIndex;
  int_fast32_t oct;
  double bendDec;
  int_fast32_t outHz;
  int_fast32_t bendI;
  uint_fast32_t noteI;
  double tone_local;
  
  freqIndex = 0;
  local_40 = ((long)tone | (long)(tone - 9.223372036854776e+18) & (long)tone >> 0x3f) * 0x20 +
             ((long)(((tone - (double)(int)tone) * 128.0) / 2.0) + 0x80 >> 1);
  if (local_40 < 0) {
    local_40 = 0;
  }
  else if (0x11a < local_40) {
    freqIndex = (local_40 + -0x11b) / 0x180;
    local_40 = (local_40 + -0x11b) % 0x180 + 0x11b;
  }
  bendDec = (double)s_dmx_freq_table[local_40];
  for (; 1 < freqIndex; freqIndex = freqIndex + -1) {
    bendDec = (double)((long)bendDec << 1);
  }
  return (double)(long)bendDec;
}

Assistant:

static inline double s_dmxFreq(double tone)
{
    uint_fast32_t noteI = (uint_fast32_t)(tone);
    int_fast32_t bendI = 0;
    int_fast32_t outHz = 0;
    double bendDec = tone - (int)tone;

    bendI = (int_fast32_t)((bendDec * 128.0) / 2.0) + 128;
    bendI = bendI >> 1;

    int_fast32_t oct = 0;
    int_fast32_t freqIndex = (noteI << 5) + bendI;

#define MAX_FREQ_IDX 283 // 284 - with the DMX side bug
    if(freqIndex < 0)
        freqIndex = 0;
    else if(freqIndex >= MAX_FREQ_IDX)
    {
        freqIndex -= MAX_FREQ_IDX;
        oct = freqIndex / 384;
        freqIndex = (freqIndex % 384) + MAX_FREQ_IDX;
    }
#undef MAX_FREQ_IDX

    outHz = s_dmx_freq_table[freqIndex];

    while(oct > 1)
    {
        outHz *= 2;
        oct -= 1;
    }

    return (double)outHz;
}